

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall
OSTEI_VRR_Writer::WriteVRRSteps_
          (OSTEI_VRR_Writer *this,ostream *os,QAM *am,VRR_StepSet *vs,string *num_n)

{
  _Base_ptr *pp_Var1;
  Quartet *this_00;
  _Base_ptr *this_01;
  _Base_ptr *this_02;
  _Base_ptr *this_03;
  Quartet *this_04;
  _Base_ptr *this_05;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  _Base_ptr p_Var7;
  undefined1 *puVar8;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  QAM *pQVar9;
  string vrr_const0;
  string vrr_const2;
  string vrr_const1;
  string aoppq;
  string aover;
  string primname;
  string ppa;
  string vrr_const3;
  string stepdir;
  _Rb_tree_node_base *local_1c0;
  string srcname [8];
  undefined1 local_b0 [48];
  string local_80;
  undefined1 local_60 [48];
  
  std::operator<<(os,"\n");
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"// Forming ");
  PrimVarName_abi_cxx11_(srcname,am);
  poVar4 = std::operator<<(poVar4,(string *)srcname);
  poVar4 = std::operator<<(poVar4,"[");
  poVar4 = std::operator<<(poVar4,(string *)num_n);
  poVar4 = std::operator<<(poVar4," * ");
  QAM::QAM((QAM *)local_b0,am);
  iVar3 = NCART((QAM *)local_b0);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
  std::operator<<(poVar4,"];\n");
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)srcname);
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"for(n = 0; n < ");
  poVar4 = std::operator<<(poVar4,(string *)num_n);
  std::operator<<(poVar4,"; ++n)  // loop over orders of auxiliary function\n");
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar4,"{\n");
  std::operator<<(os,"\n");
  p_Var7 = (vs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1c0 = &(vs->_M_t)._M_impl.super__Rb_tree_header._M_header;
  while( true ) {
    if (p_Var7 == local_1c0) break;
    srcname[0]._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var7[0x30]._M_left;
    StringBuilder<char[2],int,char_const(&)[2]>
              (&stepdir,(char (*) [2])0x13b083,(int *)srcname,(char (*) [2])0x13d145);
    PrimVarName_abi_cxx11_(srcname,am);
    pQVar9 = am;
    QAM::QAM((QAM *)local_60,am);
    iVar3 = NCART((QAM *)local_60);
    aoppq._M_dataplus._M_p._0_4_ = iVar3;
    pcVar5 = Quartet::index((Quartet *)&p_Var7[1]._M_parent,(char *)pQVar9,__c);
    aover._M_dataplus._M_p._0_4_ = (int)pcVar5;
    StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
              (&primname,srcname,(char (*) [6])"[n * ",(int *)&aoppq,(char (*) [4])0x13e02d,
               (int *)&aover,(char (*) [2])0x13d145);
    std::__cxx11::string::~string((string *)(local_60 + 0x10));
    std::__cxx11::string::~string((string *)srcname);
    lVar6 = 0x10;
    do {
      puVar8 = (undefined1 *)((long)&srcname[0]._M_dataplus._M_p + lVar6);
      *(undefined1 **)((long)&stepdir.field_2 + lVar6 + 8) = puVar8;
      *(undefined8 *)((long)srcname + lVar6 + -8) = 0;
      *puVar8 = 0;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0x110);
    pp_Var1 = &p_Var7[6]._M_left;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)pp_Var1);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)pp_Var1);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)pp_Var1,(char *)pQVar9,__c_00);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [6])"[n * ",(int *)&vrr_const1,(char (*) [4])0x13e02d,
                 (int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)srcname,(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    pp_Var1 = &p_Var7[0xb]._M_right;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)pp_Var1);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)pp_Var1);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)pp_Var1,(char *)pQVar9,__c_01);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [10])"[(n+1) * ",(int *)&vrr_const1,
                 (char (*) [4])0x13e02d,(int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 1),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_00 = (Quartet *)(p_Var7 + 0x11);
    bVar2 = Quartet::operator_cast_to_bool(this_00);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,this_00);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart(this_00);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index(this_00,(char *)pQVar9,__c_02);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [6])"[n * ",(int *)&vrr_const1,(char (*) [4])0x13e02d,
                 (int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 2),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_01 = &p_Var7[0x16]._M_parent;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_01);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)this_01);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)this_01);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)this_01,(char *)pQVar9,__c_03);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [10])"[(n+1) * ",(int *)&vrr_const1,
                 (char (*) [4])0x13e02d,(int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 3),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_02 = &p_Var7[0x1b]._M_left;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_02);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)this_02);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)this_02);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)this_02,(char *)pQVar9,__c_04);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[6],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [6])"[n * ",(int *)&vrr_const1,(char (*) [4])0x13e02d,
                 (int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 4),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_03 = &p_Var7[0x20]._M_right;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_03);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)this_03);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)this_03);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)this_03,(char *)pQVar9,__c_05);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [10])"[(n+1) * ",(int *)&vrr_const1,
                 (char (*) [4])0x13e02d,(int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 5),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_04 = (Quartet *)(p_Var7 + 0x26);
    bVar2 = Quartet::operator_cast_to_bool(this_04);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,this_04);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart(this_04);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index(this_04,(char *)pQVar9,__c_06);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [10])"[(n+1) * ",(int *)&vrr_const1,
                 (char (*) [4])0x13e02d,(int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 6),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    this_05 = &p_Var7[0x2b]._M_parent;
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_05);
    if (bVar2) {
      pQVar9 = (QAM *)&aoppq;
      Quartet::amlist(pQVar9,(Quartet *)this_05);
      PrimVarName_abi_cxx11_(&vrr_const0,pQVar9);
      iVar3 = Quartet::ncart((Quartet *)this_05);
      vrr_const1._M_dataplus._M_p._0_4_ = iVar3;
      pcVar5 = Quartet::index((Quartet *)this_05,(char *)pQVar9,__c_07);
      vrr_const2._M_dataplus._M_p._0_4_ = (int)pcVar5;
      StringBuilder<std::__cxx11::string,char_const(&)[10],int,char_const(&)[4],int,char_const(&)[2]>
                (&aover,&vrr_const0,(char (*) [10])"[(n+1) * ",(int *)&vrr_const1,
                 (char (*) [4])0x13e02d,(int *)&vrr_const2,(char (*) [2])0x13d145);
      std::__cxx11::string::operator=((string *)(srcname + 7),(string *)&aover);
      std::__cxx11::string::~string((string *)&aover);
      std::__cxx11::string::~string((string *)&vrr_const0);
      std::__cxx11::string::~string((string *)aoppq.field_2._M_local_buf);
    }
    aoppq._M_dataplus._M_p = (pointer)&aoppq.field_2;
    aoppq._M_string_length = 0;
    aover._M_dataplus._M_p = (pointer)&aover.field_2;
    aover._M_string_length = 0;
    vrr_const0._M_dataplus._M_p = (pointer)&vrr_const0.field_2;
    vrr_const0._M_string_length = 0;
    aoppq.field_2._M_local_buf[0] = '\0';
    aover.field_2._M_local_buf[0] = '\0';
    vrr_const0.field_2._M_local_buf[0] = '\0';
    vrr_const1._M_dataplus._M_p = (pointer)&vrr_const1.field_2;
    vrr_const1._M_string_length = 0;
    vrr_const1.field_2._M_local_buf[0] = '\0';
    vrr_const2._M_dataplus._M_p = (pointer)&vrr_const2.field_2;
    vrr_const2._M_string_length = 0;
    vrr_const3._M_dataplus._M_p = (pointer)&vrr_const3.field_2;
    vrr_const3._M_string_length = 0;
    vrr_const2.field_2._M_local_buf[0] = '\0';
    vrr_const3.field_2._M_local_buf[0] = '\0';
    if (p_Var7[1]._M_color < 2) {
      StringBuilder<char[7],std::__cxx11::string&>(&ppa,(char (*) [7])"aop_PQ",&stepdir);
      std::__cxx11::string::operator=((string *)&aoppq,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      std::__cxx11::string::assign((char *)&aover);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                (&ppa,(char (*) [11])0x13abe1,(int *)((long)&p_Var7[0x30]._M_left + 4),
                 (char (*) [9])0x13aa20);
      std::__cxx11::string::operator=((string *)&vrr_const0,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                (&ppa,(char (*) [11])0x13abe1,(int *)&p_Var7[0x30]._M_right,(char (*) [9])0x13aa20);
      std::__cxx11::string::operator=((string *)&vrr_const1,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                (&ppa,(char (*) [11])0x13abe1,(int *)((long)&p_Var7[0x30]._M_right + 4),
                 (char (*) [10])0x13aa03);
      std::__cxx11::string::operator=((string *)&vrr_const2,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                (&ppa,(char (*) [11])0x13abe1,(int *)(p_Var7 + 0x31),(char (*) [10])0x13aa03);
      std::__cxx11::string::operator=((string *)&vrr_const3,(string *)&ppa);
    }
    else {
      StringBuilder<char[7],std::__cxx11::string&>(&ppa,(char (*) [7])"aoq_PQ",&stepdir);
      std::__cxx11::string::operator=((string *)&aoppq,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      std::__cxx11::string::assign((char *)&aover);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                (&ppa,(char (*) [11])0x13abe1,(int *)((long)&p_Var7[0x30]._M_right + 4),
                 (char (*) [9])0x13aa3c);
      std::__cxx11::string::operator=((string *)&vrr_const0,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[9]>
                (&ppa,(char (*) [11])0x13abe1,(int *)(p_Var7 + 0x31),(char (*) [9])0x13aa3c);
      std::__cxx11::string::operator=((string *)&vrr_const1,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                (&ppa,(char (*) [11])0x13abe1,(int *)((long)&p_Var7[0x30]._M_left + 4),
                 (char (*) [10])0x13aa03);
      std::__cxx11::string::operator=((string *)&vrr_const2,(string *)&ppa);
      std::__cxx11::string::~string((string *)&ppa);
      StringBuilder<char[11],int_const&,char_const(&)[10]>
                (&ppa,(char (*) [11])0x13abe1,(int *)&p_Var7[0x30]._M_right,(char (*) [10])0x13aa03)
      ;
      std::__cxx11::string::operator=((string *)&vrr_const3,(string *)&ppa);
    }
    std::__cxx11::string::~string((string *)&ppa);
    if (p_Var7[1]._M_color < 2) {
      StringBuilder<char[5],std::__cxx11::string&>(&ppa,(char (*) [5])"P_PA",&stepdir);
      if (p_Var7[1]._M_color != _S_red) {
        StringBuilder<char[5],std::__cxx11::string&>(&local_80,(char (*) [5])"P_PB",&stepdir);
        std::__cxx11::string::operator=((string *)&ppa,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      poVar4 = std::operator<<(poVar4," = SIMINT_MUL(");
      poVar4 = std::operator<<(poVar4,(string *)&ppa);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)srcname);
      std::operator<<(poVar4,");\n");
    }
    else {
      StringBuilder<char[5],std::__cxx11::string&>(&ppa,(char (*) [5])"Q_PA",&stepdir);
      if (p_Var7[1]._M_color != 2) {
        StringBuilder<char[5],std::__cxx11::string&>(&local_80,(char (*) [5])"Q_PB",&stepdir);
        std::__cxx11::string::operator=((string *)&ppa,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      poVar4 = std::operator<<(poVar4," = SIMINT_MUL(");
      poVar4 = std::operator<<(poVar4,(string *)&ppa);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)srcname);
      std::operator<<(poVar4,");\n");
    }
    std::__cxx11::string::~string((string *)&ppa);
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)pp_Var1);
    if (bVar2) {
      poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      poVar4 = std::operator<<(poVar4," = SIMINT_FMADD( ");
      poVar4 = std::operator<<(poVar4,(string *)&aoppq);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)(srcname + 1));
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      std::operator<<(poVar4,");\n");
    }
    bVar2 = Quartet::operator_cast_to_bool(this_00);
    if (bVar2) {
      bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_01);
      if (bVar2) {
        poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,(string *)&primname);
        poVar4 = std::operator<<(poVar4," = SIMINT_FMADD( ");
        poVar4 = std::operator<<(poVar4,(string *)&vrr_const0);
        poVar4 = std::operator<<(poVar4,", SIMINT_FMADD(");
        poVar4 = std::operator<<(poVar4,(string *)&aover);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(srcname + 3));
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(srcname + 2));
        poVar4 = std::operator<<(poVar4,"), ");
        poVar4 = std::operator<<(poVar4,(string *)&primname);
        std::operator<<(poVar4,");\n");
      }
    }
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_02);
    if (bVar2) {
      bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_03);
      if (bVar2) {
        poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,(string *)&primname);
        poVar4 = std::operator<<(poVar4," = SIMINT_FMADD( ");
        poVar4 = std::operator<<(poVar4,(string *)&vrr_const1);
        poVar4 = std::operator<<(poVar4,", SIMINT_FMADD(");
        poVar4 = std::operator<<(poVar4,(string *)&aover);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(srcname + 5));
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(srcname + 4));
        poVar4 = std::operator<<(poVar4,"), ");
        poVar4 = std::operator<<(poVar4,(string *)&primname);
        std::operator<<(poVar4,");\n");
      }
    }
    bVar2 = Quartet::operator_cast_to_bool(this_04);
    if (bVar2) {
      poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      poVar4 = std::operator<<(poVar4," = SIMINT_FMADD( ");
      poVar4 = std::operator<<(poVar4,(string *)&vrr_const2);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)(srcname + 6));
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      std::operator<<(poVar4,");\n");
    }
    bVar2 = Quartet::operator_cast_to_bool((Quartet *)this_05);
    if (bVar2) {
      poVar4 = std::operator<<(os,(string *)&indent6_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      poVar4 = std::operator<<(poVar4," = SIMINT_FMADD( ");
      poVar4 = std::operator<<(poVar4,(string *)&vrr_const3);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)(srcname + 7));
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&primname);
      std::operator<<(poVar4,");\n");
    }
    std::operator<<(os,"\n");
    std::__cxx11::string::~string((string *)&vrr_const3);
    std::__cxx11::string::~string((string *)&vrr_const2);
    std::__cxx11::string::~string((string *)&vrr_const1);
    std::__cxx11::string::~string((string *)&vrr_const0);
    std::__cxx11::string::~string((string *)&aover);
    std::__cxx11::string::~string((string *)&aoppq);
    lVar6 = 0xe0;
    do {
      std::__cxx11::string::~string((string *)((long)&srcname[0]._M_dataplus._M_p + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    std::__cxx11::string::~string((string *)&primname);
    std::__cxx11::string::~string((string *)&stepdir);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  }
  poVar4 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  std::operator<<(poVar4,"}\n");
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRSteps_(std::ostream & os, QAM am, const VRR_StepSet & vs, const std::string & num_n) const
{
    os << "\n";
    os << indent5 << "// Forming " << PrimVarName(am) << "[" << num_n << " * " << NCART(am) << "];\n";

    os << indent5 << "for(n = 0; n < " << num_n << "; ++n)  // loop over orders of auxiliary function\n";
    os << indent5 << "{\n";

    os << "\n";

    // iterate over the requirements
    // should be in order since it's a set
    for(const auto & it : vs)
    {
        // Get the stepping
        XYZStep step = it.xyz;
        std::string stepdir = StringBuilder("[", static_cast<int>(step), "]");

        std::string primname = StringBuilder(PrimVarName(am), "[n * ", NCART(am), " + ", it.target.index(), "]");
        std::string srcname[8];

        if(it.src[0])
            srcname[0] = StringBuilder(PrimVarName(it.src[0].amlist()), "[n * ", it.src[0].ncart(), " + ", it.src[0].index(), "]");
        if(it.src[1])
            srcname[1] = StringBuilder( PrimVarName(it.src[1].amlist()), "[(n+1) * ", it.src[1].ncart(), " + ", it.src[1].index(), "]");
        if(it.src[2])
            srcname[2] = StringBuilder(PrimVarName(it.src[2].amlist()), "[n * ", it.src[2].ncart(), " + ", it.src[2].index(), "]");
        if(it.src[3])
            srcname[3] = StringBuilder(PrimVarName(it.src[3].amlist()), "[(n+1) * ", it.src[3].ncart(), " + ", it.src[3].index(), "]");
        if(it.src[4])
            srcname[4] = StringBuilder(PrimVarName(it.src[4].amlist()), "[n * ", it.src[4].ncart(), " + ", it.src[4].index(), "]");
        if(it.src[5])
            srcname[5] = StringBuilder(PrimVarName(it.src[5].amlist()), "[(n+1) * ", it.src[5].ncart(), " + ", it.src[5].index(), "]");
        if(it.src[6])
            srcname[6] = StringBuilder(PrimVarName(it.src[6].amlist()), "[(n+1) * ", it.src[6].ncart(), " + ", it.src[6].index(), "]");
        if(it.src[7])
            srcname[7] = StringBuilder(PrimVarName(it.src[7].amlist()), "[(n+1) * ", it.src[7].ncart(), " + ", it.src[7].index(), "]");

        std::string aoppq, aover;
        std::string vrr_const0, vrr_const1, vrr_const2, vrr_const3;

        // Note - the signs on a_over_p, a_over_q, etc, are taken care of in FileWriter.cpp
        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            aoppq = StringBuilder("aop_PQ", stepdir);
            aover = "a_over_p";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2p");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2p");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2pq");
        }
        else
        {
            aoppq = StringBuilder("aoq_PQ", stepdir);
            aover = "a_over_q";
            vrr_const0 = StringBuilder("vrr_const_", it.ijkl[2], "_over_2q");
            vrr_const1 = StringBuilder("vrr_const_", it.ijkl[3], "_over_2q");
            vrr_const2 = StringBuilder("vrr_const_", it.ijkl[0], "_over_2pq");
            vrr_const3 = StringBuilder("vrr_const_", it.ijkl[1], "_over_2pq");
        }


        if(it.type == RRStepType::I || it.type == RRStepType::J)
        {
            std::string ppa = StringBuilder("P_PA", stepdir);

            if(it.type != RRStepType::I)
                ppa = StringBuilder("P_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << ppa << ", " << srcname[0] << ");\n";
        }
        else
        {
            std::string qpa = StringBuilder("Q_PA", stepdir);

            if(it.type != RRStepType::K)
                qpa = StringBuilder("Q_PB", stepdir);

            os << indent6 << primname << " = SIMINT_MUL(" << qpa << ", " << srcname[0] << ");\n";
        }

        if(it.src[1])
            os << indent6 << primname << " = SIMINT_FMADD( " << aoppq << ", " << srcname[1] << ", " << primname << ");\n";
        if(it.src[2] && it.src[3])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const0 << ", SIMINT_FMADD(" << aover << ", " << srcname[3] << ", " << srcname[2] << "), " << primname << ");\n";
        if(it.src[4] && it.src[5])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const1 << ", SIMINT_FMADD(" << aover << ", " << srcname[5] << ", " << srcname[4] << "), " << primname << ");\n";
        if(it.src[6])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const2 << ", " << srcname[6] << ", " << primname << ");\n";
        if(it.src[7])
            os << indent6 << primname << " = SIMINT_FMADD( " << vrr_const3 << ", " << srcname[7] << ", " << primname << ");\n";
        
        os << "\n";

    }

    os << indent5 << "}\n";
}